

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_reader::read_define_restart_interval_segment(jpeg_stream_reader *this)

{
  uint16_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  jpeg_stream_reader *this_local;
  
  sVar3 = const_byte_span::size(&this->segment_data_);
  if (sVar3 == 2) {
    uVar1 = read_uint16(this);
    (this->parameters_).restart_interval = (uint)uVar1;
  }
  else if (sVar3 == 3) {
    uVar2 = read_uint24(this);
    (this->parameters_).restart_interval = uVar2;
  }
  else {
    if (sVar3 != 4) {
      impl::throw_jpegls_error(invalid_marker_segment_size);
    }
    uVar2 = read_uint32(this);
    (this->parameters_).restart_interval = uVar2;
  }
  return;
}

Assistant:

void jpeg_stream_reader::read_define_restart_interval_segment()
{
    // Note: The JPEG-LS standard supports a 2,3 or 4 byte restart interval (see ISO/IEC 14495-1, C.2.5)
    //       The original JPEG standard only supports 2 bytes (16 bit big endian).
    switch (segment_data_.size())
    {
    case 2:
        parameters_.restart_interval = read_uint16();
        break;

    case 3:
        parameters_.restart_interval = read_uint24();
        break;

    case 4:
        parameters_.restart_interval = read_uint32();
        break;

    default:
        throw_jpegls_error(jpegls_errc::invalid_marker_segment_size);
    }
}